

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

void __thiscall chaiscript::exception::eval_error::eval_error(eval_error *this,string *t_why)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"Error: \"",t_why);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_48 = *plVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__eval_error_00311380;
  (this->reason)._M_dataplus._M_p = (pointer)&(this->reason).field_2;
  pcVar1 = (t_why->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->reason,pcVar1,pcVar1 + t_why->_M_string_length);
  (this->start_position).line = 0;
  (this->start_position).column = 0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->detail)._M_dataplus._M_p = (pointer)&(this->detail).field_2;
  (this->detail)._M_string_length = 0;
  (this->detail).field_2._M_local_buf[0] = '\0';
  (this->call_stack).
  super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->call_stack).
  super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->call_stack).
  super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

eval_error(const std::string &t_why) CHAISCRIPT_NOEXCEPT
        : std::runtime_error("Error: \"" + t_why + "\" "),
        reason(t_why) 
      {}